

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O1

void __thiscall
duckdb::PatasGroupState<unsigned_long>::LoadValues<false>
          (PatasGroupState<unsigned_long> *this,unsigned_long *value_buffer,idx_t count)

{
  byte bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *puVar6;
  uint32_t uVar7;
  
  *value_buffer = 0;
  if (count != 0) {
    puVar2 = (this->byte_reader).buffer;
    uVar7 = (this->byte_reader).index;
    puVar6 = &this->unpacked_data[0].index_diff;
    do {
      bVar1 = puVar6[-1];
      uVar3 = value_buffer[-(ulong)*puVar6];
      switch(((PatasUnpackedValueStats *)(puVar6 + -2))->significant_bytes) {
      case '\x01':
        uVar4 = (ulong)puVar2[uVar7];
        iVar5 = 1;
        break;
      case '\x02':
        uVar4 = (ulong)*(ushort *)(puVar2 + uVar7);
        iVar5 = 2;
        break;
      case '\x03':
        uVar4 = (ulong)CONCAT12(puVar2[(ulong)uVar7 + 2],*(undefined2 *)(puVar2 + uVar7));
        iVar5 = 3;
        break;
      case '\x04':
        uVar4 = (ulong)*(uint *)(puVar2 + uVar7);
        iVar5 = 4;
        break;
      case '\x05':
        uVar4 = (ulong)CONCAT14(puVar2[(ulong)uVar7 + 4],*(undefined4 *)(puVar2 + uVar7));
        iVar5 = 5;
        break;
      case '\x06':
        uVar4 = (ulong)CONCAT24(*(undefined2 *)(puVar2 + (ulong)uVar7 + 4),
                                *(undefined4 *)(puVar2 + uVar7));
        iVar5 = 6;
        break;
      case '\a':
        uVar4 = (ulong)CONCAT34(CONCAT12(puVar2[(ulong)uVar7 + 6],
                                         *(undefined2 *)(puVar2 + (ulong)uVar7 + 4)),
                                *(undefined4 *)(puVar2 + uVar7));
        iVar5 = 7;
        break;
      default:
        if (bVar1 < 8) {
          uVar4 = *(ulong *)(puVar2 + uVar7);
          iVar5 = 8;
          break;
        }
        uVar4 = 0;
        goto LAB_005b06f7;
      }
      uVar7 = uVar7 + iVar5;
      (this->byte_reader).index = uVar7;
LAB_005b06f7:
      *value_buffer = uVar4 << (bVar1 & 0x3f) ^ uVar3;
      value_buffer = value_buffer + 1;
      puVar6 = puVar6 + 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void LoadValues(EXACT_TYPE *value_buffer, idx_t count) {
		if (SKIP) {
			return;
		}
		value_buffer[0] = (EXACT_TYPE)0;
		for (idx_t i = 0; i < count; i++) {
			value_buffer[i] = patas::PatasDecompression<EXACT_TYPE>::DecompressValue(
			    byte_reader, unpacked_data[i].significant_bytes, unpacked_data[i].trailing_zeros,
			    value_buffer[i - unpacked_data[i].index_diff]);
		}
	}